

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void reset_nonplayer_visible_characters(tgestate_t *state)

{
  uint8_t iters;
  vischar_t *vischar;
  vischar_t *in_stack_00000018;
  tgestate_t *in_stack_00000020;
  undefined1 local_11;
  
  local_11 = '\a';
  do {
    reset_visible_character(in_stack_00000020,in_stack_00000018);
    local_11 = local_11 + -1;
  } while (local_11 != '\0');
  return;
}

Assistant:

void reset_nonplayer_visible_characters(tgestate_t *state)
{
  vischar_t *vischar; /* was HL */
  uint8_t    iters;   /* was B */

  assert(state != NULL);

  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
    reset_visible_character(state, vischar++);
  while (--iters);
}